

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::ConcurrentSSBOAtomicCounterMixedCase::init
          (ConcurrentSSBOAtomicCounterMixedCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  deUint32 err;
  int extraout_EAX;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestLog *pTVar5;
  ShaderProgram *pSVar6;
  ProgramSources *pPVar7;
  TestError *pTVar8;
  allocator<char> local_369;
  string local_368;
  undefined1 local_341;
  string local_340;
  ShaderSource local_320;
  ProgramSources local_2f8;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  ScopedLogSection local_1d8;
  ScopedLogSection section_1;
  string local_1c8;
  undefined1 local_1a1;
  string local_1a0;
  ShaderSource local_180;
  ProgramSources local_158;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  ScopedLogSection local_28;
  ScopedLogSection section;
  deUint32 zeroBuf [2];
  Functions *gl;
  ConcurrentSSBOAtomicCounterMixedCase *this_local;
  long lVar4;
  
  pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  section.m_log = (TestLog *)0x0;
  (**(code **)(lVar4 + 0x6c8))(1,&this->m_bufferID);
  (**(code **)(lVar4 + 0x40))(0x90d2,this->m_bufferID);
  (**(code **)(lVar4 + 0x150))(0x90d2,8,&section,0x88ea);
  err = (**(code **)(lVar4 + 0x800))();
  glu::checkError(err,"gen buffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0xbc5);
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"SSBOProgram",&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"SSBO atomic program",&local_81);
  tcu::ScopedLogSection::ScopedLogSection(&local_28,pTVar5,&local_48,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  pSVar6 = (ShaderProgram *)operator_new(0xd0);
  local_1a1 = 1;
  pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_158);
  Functional::(anonymous_namespace)::ConcurrentSSBOAtomicCounterMixedCase::
  genSSBOComputeSource_abi_cxx11_(&local_1a0,this);
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_180,&local_1a0);
  pPVar7 = glu::ProgramSources::operator<<(&local_158,&local_180);
  glu::ShaderProgram::ShaderProgram(pSVar6,pRVar3,pPVar7);
  local_1a1 = 0;
  this->m_ssboAtomicProgram = pSVar6;
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_180);
  std::__cxx11::string::~string((string *)&local_1a0);
  glu::ProgramSources::~ProgramSources(&local_158);
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::operator<<(pTVar5,this->m_ssboAtomicProgram);
  bVar1 = glu::ShaderProgram::isOk(this->m_ssboAtomicProgram);
  if (!bVar1) {
    section_1.m_log._6_1_ = 1;
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,"could not build program",
               (allocator<char> *)((long)&section_1.m_log + 7));
    tcu::TestError::TestError(pTVar8,&local_1c8);
    section_1.m_log._6_1_ = 0;
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_28);
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"AtomicCounterProgram",&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"Atomic counter program",&local_221);
  tcu::ScopedLogSection::ScopedLogSection(&local_1d8,pTVar5,&local_1f8,&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  pSVar6 = (ShaderProgram *)operator_new(0xd0);
  local_341 = 1;
  pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_2f8);
  Functional::(anonymous_namespace)::ConcurrentSSBOAtomicCounterMixedCase::
  genAtomicCounterComputeSource_abi_cxx11_(&local_340,this);
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_320,&local_340);
  pPVar7 = glu::ProgramSources::operator<<(&local_2f8,&local_320);
  glu::ShaderProgram::ShaderProgram(pSVar6,pRVar3,pPVar7);
  local_341 = 0;
  this->m_atomicCounterProgram = pSVar6;
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_320);
  std::__cxx11::string::~string((string *)&local_340);
  glu::ProgramSources::~ProgramSources(&local_2f8);
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::operator<<(pTVar5,this->m_atomicCounterProgram);
  bVar1 = glu::ShaderProgram::isOk(this->m_atomicCounterProgram);
  if (!bVar1) {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_368,"could not build program",&local_369);
    tcu::TestError::TestError(pTVar8,&local_368);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_1d8);
  return extraout_EAX;
}

Assistant:

void ConcurrentSSBOAtomicCounterMixedCase::init (void)
{
	const glw::Functions&		gl			= m_context.getRenderContext().getFunctions();
	const deUint32				zeroBuf[2]	= { 0, 0 };

	// gen buffer

	gl.genBuffers(1, &m_bufferID);
	gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, m_bufferID);
	gl.bufferData(GL_SHADER_STORAGE_BUFFER, (int)(sizeof(deUint32) * 2), zeroBuf, GL_DYNAMIC_COPY);

	GLU_EXPECT_NO_ERROR(gl.getError(), "gen buffers");

	// gen programs

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "SSBOProgram", "SSBO atomic program");

		m_ssboAtomicProgram = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(genSSBOComputeSource()));
		m_testCtx.getLog() << *m_ssboAtomicProgram;
		if (!m_ssboAtomicProgram->isOk())
			throw tcu::TestError("could not build program");
	}
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "AtomicCounterProgram", "Atomic counter program");

		m_atomicCounterProgram = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(genAtomicCounterComputeSource()));
		m_testCtx.getLog() << *m_atomicCounterProgram;
		if (!m_atomicCounterProgram->isOk())
			throw tcu::TestError("could not build program");
	}
}